

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O3

void __thiscall GLFWGraphicsContext::GLFWGraphicsContext(GLFWGraphicsContext *this)

{
  int iVar1;
  GLFWwindow *handle;
  char *__s;
  char *__s_00;
  size_t sVar2;
  runtime_error *this_00;
  
  (this->super_GraphicsContext)._vptr_GraphicsContext =
       (_func_int **)&PTR__GLFWGraphicsContext_001e1500;
  this->_window = (GLFWwindow *)0x0;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    glfwWindowHint(0x22002,4);
    glfwWindowHint(0x22003,3);
    glfwWindowHint(0x20004,0);
    handle = glfwCreateWindow(0x10,0x10,"Root graphics context",(GLFWmonitor *)0x0,(GLFWwindow *)0x0
                             );
    glfwMakeContextCurrent(handle);
    glfwSwapInterval(1);
    glewExperimental = '\x01';
    glewInit();
    if (__GLEW_VERSION_4_1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"glew didn\'t init properly",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
    }
    if (__glewProgramParameteri == (PFNGLPROGRAMPARAMETERIPROC)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"glew didn\'t init properly",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
    }
    __s = (char *)glGetString(0x1f01);
    __s_00 = (char *)glGetString(0x1f02);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"OpenGL Renderer: ",0x11);
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x212518);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"OpenGL Version: ",0x10);
    if (__s_00 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x212518);
    }
    else {
      sVar2 = strlen(__s_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s_00,sVar2);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    this->_window = handle;
    glfwMakeContextCurrent((GLFWwindow *)0x0);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Could not initialize glfw");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

GLFWGraphicsContext()
    {
        glfwSetErrorCallback(error_callback);
        if (!glfwInit())
            throw std::runtime_error("Could not initialize glfw");

        setGlfwFlags();
        glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);

        GLFWwindow* window = glfwCreateWindow(16, 16, "Root graphics context", NULL, NULL);
        glfwMakeContextCurrent(window);
        glfwSwapInterval(1); // must be set when a window's context is current

        glewExperimental = GL_TRUE;
        glewInit(); // create GLEW after the context has been created

        if (!GLEW_VERSION_4_1)
            std::cerr << "glew didn't init properly" << std::endl;

        if (!glProgramParameteri)
            std::cerr << "glew didn't init properly" << std::endl;

        // get version info
        const GLubyte* renderer = glGetString(GL_RENDERER); // get renderer string
        const GLubyte* version = glGetString(GL_VERSION); // version as a string
        std::cout << "OpenGL Renderer: " << renderer << std::endl;
        std::cout << "OpenGL Version: " << version << std::endl;

        _window = window;

        // the context should only be captured when it's in use, as it can't be
        // captured in two places at once
        glfwMakeContextCurrent(nullptr);
    }